

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O2

void Cmd_writemidi(FCommandLine *argv,APlayerPawn *who,int key)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  FILE *__s;
  size_t sVar4;
  TArray<unsigned_char,_unsigned_char> midi;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 == 2) {
    if (currSong == (MusInfo *)0x0) {
      pcVar3 = "No song is currently playing.\n";
    }
    else {
      iVar2 = (*currSong->_vptr_MusInfo[9])();
      if ((char)iVar2 != '\0') {
        midi.Array = (uchar *)0x0;
        midi.Most = 0;
        midi.Count = 0;
        MIDIStreamer::CreateSMF((MIDIStreamer *)currSong,&midi,1);
        pcVar3 = FCommandLine::operator[](argv,1);
        __s = fopen(pcVar3,"wb");
        if (__s == (FILE *)0x0) {
          pcVar3 = FCommandLine::operator[](argv,1);
          Printf("Could not open %s.\n",pcVar3);
        }
        else {
          sVar4 = fwrite(midi.Array,1,(ulong)midi._8_8_ >> 0x20,__s);
          uVar1 = (ulong)midi._8_8_ >> 0x20;
          fclose(__s);
          if (sVar4 != uVar1) {
            Printf("Could not write to music file.\n");
          }
        }
        TArray<unsigned_char,_unsigned_char>::~TArray(&midi);
        return;
      }
      pcVar3 = "Current song is not MIDI-based.\n";
    }
  }
  else {
    pcVar3 = "Usage: writemidi <filename>";
  }
  Printf(pcVar3);
  return;
}

Assistant:

CCMD (writemidi)
{
	if (argv.argc() != 2)
	{
		Printf("Usage: writemidi <filename>");
		return;
	}
	if (currSong == NULL)
	{
		Printf("No song is currently playing.\n");
		return;
	}
	if (!currSong->IsMIDI())
	{
		Printf("Current song is not MIDI-based.\n");
		return;
	}

	TArray<BYTE> midi;
	FILE *f;
	bool success;

	static_cast<MIDIStreamer *>(currSong)->CreateSMF(midi, 1);
	f = fopen(argv[1], "wb");
	if (f == NULL)
	{
		Printf("Could not open %s.\n", argv[1]);
		return;
	}
	success = (fwrite(&midi[0], 1, midi.Size(), f) == (size_t)midi.Size());
	fclose (f);

	if (!success)
	{
		Printf("Could not write to music file.\n");
	}
}